

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectModel.cpp
# Opt level: O0

Oop __thiscall Lodtalk::VMContext::getGlobalFromName(VMContext *this,char *name)

{
  allocator local_49;
  string local_48;
  anon_union_8_4_0eb573b0_for_Oop_0 local_28;
  char *local_20;
  char *name_local;
  VMContext *this_local;
  
  local_20 = name;
  name_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,name,&local_49);
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeByteSymbol(this,&local_48);
  this_local = (VMContext *)getGlobalFromSymbol(this,(Oop)local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return (Oop)(anon_union_8_4_0eb573b0_for_Oop_0)this_local;
}

Assistant:

Oop VMContext::getGlobalFromName(const char *name)
{
	return getGlobalFromSymbol(makeByteSymbol(name));
}